

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb_arith_encode_log2(stb_arith *a,uint totalfreq2,uint freq,uint cumfreq)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = a->range_low;
  uVar5 = a->range_high - uVar4 >> ((byte)totalfreq2 & 0x1f);
  uVar1 = cumfreq * uVar5;
  uVar2 = uVar1 + uVar4;
  a->range_low = uVar2;
  a->range_high = uVar2 + uVar5 * freq;
  if (CARRY4(uVar1,uVar4)) {
    stb__arith_carry(a);
  }
  uVar4 = a->range_low;
  for (uVar1 = a->range_high - uVar4; uVar1 < 0x1000000; uVar1 = iVar3 + uVar1 * -0x100) {
    stb__arith_putbyte(a,uVar4 >> 0x18);
    uVar1 = a->range_low;
    uVar4 = uVar1 * 0x100;
    a->range_low = uVar4;
    iVar3 = a->range_high * 0x100;
    a->range_high = iVar3 + 0xff;
  }
  return;
}

Assistant:

void stb_arith_encode_log2(stb_arith *a, unsigned int totalfreq2, unsigned int freq, unsigned int cumfreq)
{
   unsigned int range = a->range_high - a->range_low;
   unsigned int old = a->range_low;
   range >>= totalfreq2;
   a->range_low += range * cumfreq;
   a->range_high = a->range_low + range*freq;
   if (a->range_low < old)
      stb__arith_carry(a);
   while (a->range_high - a->range_low < 0x1000000)
      stb__renorm_encoder(a);
}